

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

Image * __thiscall
pbrt::Image::SelectChannels
          (Image *__return_storage_ptr__,Image *this,ImageChannelDesc *desc,Allocator alloc)

{
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  Image *image;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  descChannelNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  long local_70;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_68;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_60;
  
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((desc->offset).nStored != 0) {
    uVar3 = 0;
    do {
      paVar1 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                *)(desc->offset).ptr;
      if (paVar1 == (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                     *)0x0) {
        paVar1 = &(desc->offset).field_2;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_88,(this->channelNames).ptr + paVar1->fixed[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (desc->offset).nStored);
  }
  channels.n = (long)local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_68.bits =
       (this->encoding).
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       .bits;
  channels.ptr = local_88.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  Image(__return_storage_ptr__,this->format,
        (Point2i)(this->resolution).super_Tuple2<pbrt::Point2,_int>,channels,
        (ColorEncodingHandle *)&local_68,alloc);
  if (0 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.y) {
    lVar2 = 0;
    lVar4 = 0;
    do {
      local_70 = lVar4;
      if (0 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.x) {
        lVar4 = 0;
        do {
          GetChannels((ImageChannelValues *)&local_60,this,(Point2i)(lVar2 + lVar4),desc,
                      (WrapMode2D)0x200000002);
          SetChannels(__return_storage_ptr__,(Point2i)(lVar2 + lVar4),
                      (ImageChannelValues *)&local_60);
          InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                    (&local_60);
          lVar4 = lVar4 + 1;
        } while (lVar4 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.x);
      }
      lVar4 = local_70 + 1;
      lVar2 = lVar2 + 0x100000000;
    } while (lVar4 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.y);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return __return_storage_ptr__;
}

Assistant:

Image Image::SelectChannels(const ImageChannelDesc &desc, Allocator alloc) const {
    std::vector<std::string> descChannelNames;
    // TODO: descChannelNames = ChannelNames(desc)
    for (size_t i = 0; i < desc.offset.size(); ++i)
        descChannelNames.push_back(channelNames[desc.offset[i]]);

    Image image(format, resolution, descChannelNames, encoding, alloc);
    for (int y = 0; y < resolution.y; ++y)
        for (int x = 0; x < resolution.x; ++x)
            image.SetChannels({x, y}, GetChannels({x, y}, desc));
    return image;
}